

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_icelance(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_RDX;
  int dam;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined1 in_stack_000012c2;
  undefined1 in_stack_000012c3;
  int in_stack_000012c4;
  int in_stack_000012c8;
  int in_stack_000012cc;
  CHAR_DATA *in_stack_000012d0;
  CHAR_DATA *in_stack_000012d8;
  int in_stack_000012f8;
  int in_stack_00001300;
  char *in_stack_00001308;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar4;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  char *format;
  undefined4 in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  int in_stack_ffffffffffffff90;
  
  iVar2 = dice(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  iVar2 = iVar2 << 1;
  bVar1 = is_ground(*(ROOM_INDEX_DATA **)(in_RDX + 0xa8));
  if (bVar1) {
    bVar1 = saves_spell(in_stack_ffffffffffffff90,
                        (CHAR_DATA *)
                        CONCAT26(in_stack_ffffffffffffff8e,
                                 CONCAT24(in_stack_ffffffffffffff8c,
                                          CONCAT22(in_stack_ffffffffffffff8a,
                                                   in_stack_ffffffffffffff88))),
                        in_stack_ffffffffffffff84);
    if (bVar1) {
      iVar2 = iVar2 / 2;
    }
    act(in_stack_ffffffffffffff60,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
        (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
        (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    act(in_stack_ffffffffffffff60,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
        (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
        (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    act(in_stack_ffffffffffffff60,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
        (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
        (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 1;
    format = (char *)0x0;
    damage_new(in_stack_000012d8,in_stack_000012d0,in_stack_000012cc,in_stack_000012c8,
               in_stack_000012c4,(bool)in_stack_000012c3,(bool)in_stack_000012c2,in_stack_000012f8,
               in_stack_00001300,in_stack_00001308);
    iVar3 = number_percent();
    if (iVar3 < 0x10) {
      init_affect((AFFECT_DATA *)0x6e567e);
      new_affect_to_char(in_stack_ffffffffffffff70,
                         (AFFECT_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff68));
      act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,uVar6),
          (void *)CONCAT44(in_stack_ffffffffffffff54,uVar5),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,uVar4),0);
      act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,uVar6),
          (void *)CONCAT44(in_stack_ffffffffffffff54,uVar5),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,uVar4),0);
    }
  }
  else {
    send_to_char(in_stack_ffffffffffffff60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  return;
}

Assistant:

void spell_icelance(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	int dam = 2 * dice(level, 3);

	if (!is_ground(ch->in_room))
	{
		send_to_char("You must have ground beneath you to cast this spell.\n\r", ch);
		return;
	}

	if (saves_spell(level, victim, DAM_COLD))
		dam /= 2;

	act("You gesture at the ground and a jagged lance of ice erupts, impaling $N!", ch, 0, victim, TO_CHAR);
	act("$n gestures at the ground and a jagged lance of ice erupts, impaling you!", ch, 0, victim, TO_VICT);
	act("$n gestures at the ground and a jagged lance of ice erupts, impaling $N!", ch, 0, victim, TO_NOTVICT);

	damage_new(ch, victim, dam, sn, DAM_PIERCE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);

	if (number_percent() <= 15)
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.duration = 8;
		af.type = gsn_bleeding;
		af.level = level;
		af.location = 0;
		af.modifier = 0;
		af.aftype = AFT_MALADY;
		af.tick_fun = bleeding_tick;
		af.end_fun = nullptr;
		af.owner = ch;
		new_affect_to_char(victim, &af);

		act("Blood spills forth from your gaping wound!", victim, 0, 0, TO_CHAR);
		act("Blood begins to pour from $n's gaping wound!", victim, 0, 0, TO_ROOM);
	}
}